

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_attributeValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  long lVar5;
  
  if (ptr < end) {
    if ((long)end - (long)ptr < 2) {
      iVar2 = -1;
    }
    else {
      for (pbVar3 = (byte *)ptr; 1 < (long)end - (long)pbVar3; pbVar3 = pbVar3 + lVar5) {
        if (pbVar3[1] - 0xd8 < 4) {
switchD_00606746_caseD_7:
          lVar5 = 4;
        }
        else {
          lVar5 = 2;
          if (pbVar3[1] == 0) {
            cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar3);
            lVar5 = 2;
            switch(cVar1) {
            case '\x02':
              *nextTokPtr = (char *)pbVar3;
              return 0;
            case '\x03':
              if (pbVar3 == (byte *)ptr) {
                iVar2 = little2_scanRef(enc,ptr + 2,end,nextTokPtr);
                return iVar2;
              }
              goto LAB_006067c8;
            case '\x04':
            case '\x05':
            case '\b':
              break;
            case '\x06':
              lVar5 = 3;
              break;
            case '\a':
              goto switchD_00606746_caseD_7;
            case '\t':
              if (pbVar3 == (byte *)ptr) {
                pcVar4 = ptr + 2;
                if (1 < (long)end - (long)pcVar4) {
                  if ((ptr[3] == '\0') &&
                     (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[2]) == '\n')) {
                    pcVar4 = ptr + 4;
                  }
                  *nextTokPtr = pcVar4;
                  return 7;
                }
                return -3;
              }
              goto LAB_006067c8;
            case '\n':
              if (pbVar3 == (byte *)ptr) {
                *nextTokPtr = ptr + 2;
                return 7;
              }
              goto LAB_006067c8;
            default:
              lVar5 = 2;
              if (cVar1 == '\x15') {
                if (pbVar3 == (byte *)ptr) {
                  *nextTokPtr = ptr + 2;
                  return 0x27;
                }
                goto LAB_006067c8;
              }
            }
          }
        }
      }
LAB_006067c8:
      *nextTokPtr = (char *)pbVar3;
      iVar2 = 6;
    }
  }
  else {
    iVar2 = -4;
  }
  return iVar2;
}

Assistant:

static int PTRCALL
PREFIX(attributeValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                          const char **nextTokPtr) {
  const char *start;
  if (ptr >= end)
    return XML_TOK_NONE;
  else if (! HAS_CHAR(enc, ptr, end)) {
    /* This line cannot be executed.  The incoming data has already
     * been tokenized once, so incomplete characters like this have
     * already been eliminated from the input.  Retaining the paranoia
     * check is still valuable, however.
     */
    return XML_TOK_PARTIAL; /* LCOV_EXCL_LINE */
  }
  start = ptr;
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LT:
      /* this is for inside entity references */
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (! HAS_CHAR(enc, ptr, end))
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_S:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_ATTRIBUTE_VALUE_S;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}